

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileChangeNotifier.cpp
# Opt level: O2

void __thiscall FileChangeNotifier::Update(FileChangeNotifier *this,float fDeltaTime)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined1 auVar3 [16];
  
  if (this->m_bActive == true) {
    FW::FileWatcher::update(this->m_pFileWatcher);
    uVar1 = this->m_fTimeUntilNextAllowedRecompile;
    uVar2 = this->m_fFileChangeSpamTimeRemaining;
    auVar3._0_4_ = (float)uVar1 - fDeltaTime;
    auVar3._4_4_ = (float)uVar2 - fDeltaTime;
    auVar3._8_4_ = 0.0 - fDeltaTime;
    auVar3._12_4_ = 0.0 - fDeltaTime;
    auVar3 = maxps(auVar3,ZEXT816(0));
    this->m_fTimeUntilNextAllowedRecompile = (float)(int)auVar3._0_8_;
    this->m_fFileChangeSpamTimeRemaining = (float)(int)((ulong)auVar3._0_8_ >> 0x20);
    if (this->m_bRecompilePending == true) {
      TriggerNotificationIfPossible(this);
      return;
    }
  }
  return;
}

Assistant:

void FileChangeNotifier::Update( float fDeltaTime )
{
	if (m_bActive)
	{
        m_pFileWatcher->update();
		m_fTimeUntilNextAllowedRecompile = max(0.0f, m_fTimeUntilNextAllowedRecompile - fDeltaTime);
		m_fFileChangeSpamTimeRemaining = max(0.0f, m_fFileChangeSpamTimeRemaining - fDeltaTime);

		if (m_bRecompilePending)
		{
			TriggerNotificationIfPossible();
		}
	}
}